

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point2f __thiscall pbrt::detail::Stratified2DIter::operator*(Stratified2DIter *this)

{
  RNG *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [64];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 extraout_var [60];
  
  iVar2 = (this->super_RNGIterator<pbrt::detail::Stratified2DIter>).
          super_IndexingIterator<pbrt::detail::Stratified2DIter>.i;
  this_00 = &(this->super_RNGIterator<pbrt::detail::Stratified2DIter>).rng;
  iVar3 = this->nx;
  fVar6 = RNG::Uniform<float>(this_00);
  auVar5 = vpinsrd_avx(ZEXT416((uint)(iVar2 % iVar3)),iVar2 / iVar3,1);
  auVar5 = vcvtdq2ps_avx(auVar5);
  uVar1 = this->nx;
  auVar8._0_4_ = RNG::Uniform<float>(this_00);
  auVar8._4_60_ = extraout_var;
  auVar4._4_4_ = extraout_XMM0_Db;
  auVar4._0_4_ = fVar6;
  auVar4._8_4_ = extraout_XMM0_Dc;
  auVar4._12_4_ = extraout_XMM0_Dd;
  auVar4 = vinsertps_avx(auVar4,auVar8._0_16_,0x10);
  local_48 = auVar5._0_4_;
  fStack_44 = auVar5._4_4_;
  fStack_40 = auVar5._8_4_;
  fStack_3c = auVar5._12_4_;
  auVar7._0_4_ = auVar4._0_4_ + local_48;
  auVar7._4_4_ = auVar4._4_4_ + fStack_44;
  auVar7._8_4_ = auVar4._8_4_ + fStack_40;
  auVar7._12_4_ = auVar4._12_4_ + fStack_3c;
  auVar5 = vpinsrd_avx(ZEXT416(uVar1),this->ny,1);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vdivps_avx(auVar7,auVar5);
  return (Point2f)auVar5._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f operator*() {
        int ix = i % nx, iy = i / nx;
        return {(ix + rng.Uniform<Float>()) / nx, (iy + rng.Uniform<Float>()) / ny};
    }